

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,float,duckdb::NotEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  value_type vVar2;
  const_reference pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  value_type rhs_offset_in_row;
  idx_t entry_idx;
  bool bVar7;
  uchar **rhs_locations;
  SelectionVector *lhs_sel;
  idx_t local_68;
  float local_50;
  float local_4c;
  data_ptr_t local_48;
  data_ptr_t local_40;
  SelectionVector *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_38 = (lhs_format->unified).sel;
  local_48 = (lhs_format->unified).data;
  local_40 = rhs_row_locations->data;
  pvVar3 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar2 = *pvVar3;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = 0;
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)sel->sel_vector[uVar6];
        }
        uVar4 = uVar5;
        if (local_38->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)local_38->sel_vector[uVar5];
        }
        local_50 = *(float *)(*(long *)(local_40 + uVar5 * 8) + vVar2);
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(local_40 + uVar5 * 8) + (col_idx >> 3))) != 0) &&
           (bVar7 = Equals::Operation<float>((float *)(local_48 + uVar4 * 4),&local_50), !bVar7)) {
          sel->sel_vector[local_68] = (sel_t)uVar5;
          local_68 = local_68 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
      return local_68;
    }
  }
  else if (count != 0) {
    local_68 = 0;
    uVar6 = 0;
    do {
      uVar5 = uVar6;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar6];
      }
      uVar4 = uVar5;
      if (local_38->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)local_38->sel_vector[uVar5];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar7 = false;
      }
      else {
        bVar7 = (puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
      }
      local_4c = *(float *)(*(long *)(local_40 + uVar5 * 8) + vVar2);
      if (((!bVar7) &&
          (((uint)*(byte *)(*(long *)(local_40 + uVar5 * 8) + (col_idx >> 3)) &
           1 << ((byte)col_idx & 7)) != 0)) &&
         (bVar7 = Equals::Operation<float>((float *)(local_48 + uVar4 * 4),&local_4c), !bVar7)) {
        sel->sel_vector[local_68] = (sel_t)uVar5;
        local_68 = local_68 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
    return local_68;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}